

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

istream * Json::operator>>(istream *sin,Value *root)

{
  CharReaderBuilder *this;
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  undefined1 local_68 [7];
  bool ok;
  string errs;
  CharReaderBuilder b;
  Value *root_local;
  istream *sin_local;
  
  this = (CharReaderBuilder *)((long)&errs.field_2 + 8);
  CharReaderBuilder::CharReaderBuilder(this);
  std::__cxx11::string::string((string *)local_68);
  bVar1 = parseFromStream((Factory *)this,sin,root,(string *)local_68);
  __stream = _stderr;
  if (!bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"Error from reader: %s",uVar2);
    throwRuntimeError((string *)local_68);
  }
  std::__cxx11::string::~string((string *)local_68);
  CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)((long)&errs.field_2 + 8));
  return sin;
}

Assistant:

JSONCPP_ISTREAM& operator>>(JSONCPP_ISTREAM& sin, Value& root) {
  CharReaderBuilder b;
  JSONCPP_STRING errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            errs.c_str());

    throwRuntimeError(errs);
  }
  return sin;
}